

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFlowAnalysis.cpp
# Opt level: O3

void __thiscall
slang::analysis::DataFlowAnalysis::handle(DataFlowAnalysis *this,ExpressionStatement *stmt)

{
  bool *pbVar1;
  Type *pTVar2;
  ExpressionStatement *local_18;
  
  ast::Expression::visitExpression<slang::ast::Expression_const,slang::analysis::DataFlowAnalysis&>
            (stmt->expr,stmt->expr,this);
  if ((stmt->expr->kind == Assignment) && (pTVar2 = stmt->expr[1].type.ptr, pTVar2 != (Type *)0x0))
  {
    pbVar1 = &(this->
              super_AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
              ).super_FlowAnalysisBase.bad;
    *pbVar1 = (bool)(*pbVar1 | (pTVar2->super_Symbol).kind == Unknown);
    local_18 = stmt;
    SmallVectorBase<slang::ast::Statement_const*>::emplace_back<slang::ast::Statement_const*>
              ((SmallVectorBase<slang::ast::Statement_const*> *)&this->timedStatements,
               (Statement **)&local_18);
  }
  return;
}

Assistant:

void DataFlowAnalysis::handle(const ExpressionStatement& stmt) {
    visitStmt(stmt);

    if (stmt.expr.kind == ExpressionKind::Assignment) {
        auto& assignment = stmt.expr.as<AssignmentExpression>();
        if (assignment.timingControl) {
            bad |= assignment.timingControl->bad();
            timedStatements.push_back(&stmt);
        }
    }
}